

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<Fad<Fad<double>_>,_3>::Resize
          (TPZManVector<Fad<Fad<double>_>,_3> *this,int64_t newsize,Fad<Fad<double>_> *object)

{
  double dVar1;
  undefined1 auVar2 [16];
  Fad<Fad<double>_> *pFVar3;
  ostream *this_00;
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  Fad<Fad<double>_> *pFVar7;
  long in_RSI;
  TPZManVector<Fad<Fad<double>_>,_3> *in_RDI;
  ulong uVar8;
  Fad<Fad<double>_> *newstore;
  int64_t realsize;
  int64_t i_2;
  int64_t i_1;
  int64_t i;
  Fad<Fad<double>_> *in_stack_ffffffffffffff08;
  Fad<Fad<double>_> *in_stack_ffffffffffffff10;
  Fad<Fad<double>_> *local_d8;
  Fad<Fad<double>_> *in_stack_ffffffffffffff30;
  Fad<Fad<double>_> *pFVar9;
  Fad<Fad<double>_> *local_a8;
  long local_30;
  long local_28;
  long local_20;
  
  if (in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else if (in_RSI != (in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fNElements) {
    if ((in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fNAlloc < in_RSI) {
      if (in_RSI < 4) {
        for (local_28 = 0; local_28 < (in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fNElements;
            local_28 = local_28 + 1) {
          Fad<Fad<double>_>::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        }
        for (; local_28 < in_RSI; local_28 = local_28 + 1) {
          Fad<Fad<double>_>::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        }
        if (((in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fStore != in_RDI->fExtAlloc) &&
           (pFVar7 = (in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fStore,
           pFVar7 != (Fad<Fad<double>_> *)0x0)) {
          dVar1 = pFVar7[-1].defaultVal.defaultVal;
          for (pFVar9 = pFVar7 + (long)dVar1; pFVar7 != pFVar9; pFVar9 = pFVar9 + -1) {
            Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffff10);
          }
          operator_delete__(&pFVar7[-1].defaultVal.defaultVal,(long)dVar1 * 0x58 + 8);
        }
        (in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fStore = in_RDI->fExtAlloc;
        (in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fNAlloc = 3;
      }
      else {
        uVar4 = ExpandSize(in_RDI,in_RSI);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar4;
        uVar5 = SUB168(auVar2 * ZEXT816(0x58),0);
        uVar8 = uVar5 + 8;
        if (SUB168(auVar2 * ZEXT816(0x58),8) != 0 || 0xfffffffffffffff7 < uVar5) {
          uVar8 = 0xffffffffffffffff;
        }
        puVar6 = (ulong *)operator_new__(uVar8);
        *puVar6 = uVar4;
        pFVar7 = (Fad<Fad<double>_> *)(puVar6 + 1);
        if (uVar4 != 0) {
          local_a8 = pFVar7;
          do {
            Fad<Fad<double>_>::Fad(in_stack_ffffffffffffff30);
            local_a8 = local_a8 + 1;
          } while (local_a8 != pFVar7 + uVar4);
        }
        for (local_30 = 0; local_30 < (in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fNElements;
            local_30 = local_30 + 1) {
          Fad<Fad<double>_>::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        }
        for (; local_30 < in_RSI; local_30 = local_30 + 1) {
          Fad<Fad<double>_>::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        }
        if (((in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fStore != in_RDI->fExtAlloc) &&
           (pFVar9 = (in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fStore,
           pFVar9 != (Fad<Fad<double>_> *)0x0)) {
          pFVar3 = pFVar9 + -1;
          dVar1 = pFVar9[-1].defaultVal.defaultVal;
          local_d8 = pFVar9 + (long)dVar1;
          if (pFVar9 != local_d8) {
            do {
              local_d8 = local_d8 + -1;
              Fad<Fad<double>_>::~Fad(local_d8);
            } while (local_d8 != pFVar9);
          }
          operator_delete__(&(pFVar3->defaultVal).defaultVal,(long)dVar1 * 0x58 + 8);
        }
        (in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fStore = pFVar7;
        (in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fNAlloc = uVar4;
      }
    }
    else {
      for (local_20 = (in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fNElements; local_20 < in_RSI;
          local_20 = local_20 + 1) {
        Fad<Fad<double>_>::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      }
      (in_RDI->super_TPZVec<Fad<Fad<double>_>_>).fNElements = in_RSI;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}